

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_memory_storage.cpp
# Opt level: O1

void __thiscall cppcms::sessions::session_memory_storage::short_gc(session_memory_storage *this)

{
  _Rb_tree_header *p_Var1;
  time_t tVar2;
  _Base_ptr p_Var3;
  uint uVar4;
  iterator __position;
  
  uVar4 = 0;
  tVar2 = time((time_t *)0x0);
  __position._M_node = (this->timeout_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->timeout_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      if (tVar2 <= *(long *)(__position._M_node + 1)) {
        return;
      }
      if (4 < uVar4) {
        return;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      cppcms::impl::details::
      basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
      ::erase(&(this->map_).impl_,(iterator)__position._M_node[1]._M_parent);
      std::
      _Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
      ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
                          *)&this->timeout_,__position);
      uVar4 = uVar4 + 1;
      __position._M_node = p_Var3;
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  return;
}

Assistant:

void short_gc()
	{
		time_t now=::time(0);
		timeout_type::iterator p=timeout_.begin(),tmp;
		int count = 0;
		while(p!=timeout_.end() && p->first < now && count < 5) {
			tmp=p;
			++p;
			map_.erase(tmp->second);
			timeout_.erase(tmp);
			count++;
		}
	}